

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_comm.c
# Opt level: O2

void do_group(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  CHAR_DATA *pCVar9;
  CClass *pCVar10;
  int iVar11;
  char *pcVar12;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  CHAR_DATA **ppCVar13;
  string_view fmt;
  format_args args;
  int *in_stack_ffffffffffffdb38;
  undefined1 local_24bc [4];
  char *local_24b8;
  int local_24ac;
  int local_24a8;
  int local_24a4;
  CHAR_DATA *local_24a0;
  char *local_2498 [3];
  double local_2480;
  string buffer;
  string local_2458;
  AFFECT_DATA af;
  char arg [4608];
  
  one_argument(argument,arg);
  if (arg[0] == '\0') {
    buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
    buffer._M_string_length = 0;
    buffer.field_2._M_local_buf[0] = '\0';
    pCVar9 = ch->leader;
    if (ch->leader == (CHAR_DATA *)0x0) {
      pCVar9 = ch;
    }
    local_2498[0] = pers(pCVar9,ch);
    fmt.size_ = 0xc;
    fmt.data_ = (char *)0xd;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_2498;
    ::fmt::v9::vformat_abi_cxx11_(&local_2458,(v9 *)"{}\'s group:\n\r",fmt,args);
    std::__cxx11::string::operator=((string *)&buffer,(string *)&local_2458);
    std::__cxx11::string::~string((string *)&local_2458);
    send_to_char(buffer._M_dataplus._M_p,ch);
    ppCVar13 = &char_list;
    local_24a0 = ch;
    while( true ) {
      ppCVar13 = &((CHAR_DATA *)ppCVar13)->next->next;
      if ((CHAR_DATA *)ppCVar13 == (CHAR_DATA *)0x0) break;
      bVar6 = is_same_group((CHAR_DATA *)ppCVar13,ch);
      if (bVar6) {
        bVar6 = is_npc((CHAR_DATA *)ppCVar13);
        if (bVar6) {
          pcVar12 = pers((CHAR_DATA *)ppCVar13,ch);
          strcpy((char *)&af,pcVar12);
          cVar5 = (char)af.next;
          if (((char)af.next != '\0') &&
             (cVar5 = (char)af.next + -0x20, 0x19 < (byte)((char)af.next + 0x9fU))) {
            cVar5 = (char)af.next;
          }
          af.next._0_1_ = cVar5;
          iVar11 = 0;
          iVar7 = 0;
          if (((CHAR_DATA *)ppCVar13)->max_hit != 0) {
            iVar7 = (((CHAR_DATA *)ppCVar13)->hit * 100) / (int)((CHAR_DATA *)ppCVar13)->max_hit;
          }
          local_2498[0] = (char *)CONCAT44(local_2498[0]._4_4_,iVar7);
          if (((CHAR_DATA *)ppCVar13)->max_mana != 0) {
            iVar11 = (((CHAR_DATA *)ppCVar13)->mana * 100) / (int)((CHAR_DATA *)ppCVar13)->max_mana;
          }
          local_24b8 = (char *)CONCAT44(local_24b8._4_4_,iVar11);
          if (((CHAR_DATA *)ppCVar13)->max_move == 0) {
            local_24bc = (undefined1  [4])0x0;
          }
          else {
            local_24bc = (undefined1  [4])
                         ((((CHAR_DATA *)ppCVar13)->move * 100) /
                         (int)((CHAR_DATA *)ppCVar13)->max_move);
          }
          ::fmt::v9::sprintf<char[43],char[4608],int,int,int,char>
                    (&local_2458,(v9 *)"[Minion] %-32s %3d%%hp %3d%%mana %3d%%mv\n\r",
                     (char (*) [43])&af,(char (*) [4608])local_2498,(int *)&local_24b8,
                     (int *)local_24bc,in_stack_ffffffffffffdb38);
          std::__cxx11::string::operator=((string *)&buffer,(string *)&local_2458);
          std::__cxx11::string::~string((string *)&local_2458);
        }
        else {
          sVar1 = ((CHAR_DATA *)ppCVar13)->level;
          iVar11 = exp_per_level((CHAR_DATA *)ppCVar13);
          iVar7 = ((CHAR_DATA *)ppCVar13)->exp;
          sVar2 = pc_race_table[((CHAR_DATA *)ppCVar13)->race].xpadd;
          sVar3 = ((CHAR_DATA *)ppCVar13)->level;
          iVar8 = exp_per_level((CHAR_DATA *)ppCVar13);
          local_2480 = (double)((sVar3 + -2) * (sVar2 + 0x5dc)) * 0.08;
          sVar4 = ((CHAR_DATA *)ppCVar13)->level;
          bVar6 = is_npc((CHAR_DATA *)ppCVar13);
          pcVar12 = "Mob";
          if (!bVar6) {
            pCVar10 = char_data::Class((char_data *)ppCVar13);
            pcVar12 = RString::operator_cast_to_char_(&pCVar10->who_name);
          }
          local_2498[0] = pcVar12;
          pcVar12 = pers((CHAR_DATA *)ppCVar13,local_24a0);
          local_24b8 = capitalize(pcVar12);
          local_24a4 = 0;
          local_24bc = (undefined1  [4])0x0;
          if (((CHAR_DATA *)ppCVar13)->max_hit != 0) {
            local_24bc = (undefined1  [4])
                         ((((CHAR_DATA *)ppCVar13)->hit * 100) /
                         (int)((CHAR_DATA *)ppCVar13)->max_hit);
          }
          if (((CHAR_DATA *)ppCVar13)->max_mana != 0) {
            local_24a4 = (((CHAR_DATA *)ppCVar13)->mana * 100) /
                         (int)((CHAR_DATA *)ppCVar13)->max_mana;
          }
          if (((CHAR_DATA *)ppCVar13)->max_move == 0) {
            local_24a8 = 0;
          }
          else {
            local_24a8 = (((CHAR_DATA *)ppCVar13)->move * 100) /
                         (int)((CHAR_DATA *)ppCVar13)->max_move;
          }
          local_24ac = ((iVar11 * sVar1 - iVar7) * 100) /
                       (iVar8 * sVar3 - (sVar4 + -1) * ((int)local_2480 + (int)sVar2 + 0x5dc));
          if (99 < local_24ac) {
            local_24ac = 100;
          }
          if (local_24ac < 1) {
            local_24ac = 0;
          }
          ::fmt::v9::sprintf<char[52],short,char_const*,char*,int,int,int,int,char>
                    (&local_2458,(v9 *)"[%2d %s] %-32s %3d%%hp %3d%%mana %3d%%mv %3d%%tnl\n\r",
                     (char (*) [52])&((CHAR_DATA *)ppCVar13)->level,(short *)local_2498,&local_24b8,
                     (char **)local_24bc,&local_24a4,&local_24a8,&local_24ac,(int *)0x64);
          std::__cxx11::string::operator=((string *)&buffer,(string *)&local_2458);
          std::__cxx11::string::~string((string *)&local_2458);
          ch = local_24a0;
        }
        send_to_char(buffer._M_dataplus._M_p,ch);
      }
    }
    std::__cxx11::string::~string((string *)&buffer);
    return;
  }
  pCVar9 = get_char_room(ch,arg);
  if (pCVar9 == (CHAR_DATA *)0x0) {
    pcVar12 = "They aren\'t here.\n\r";
  }
  else {
    if ((ch->master == (CHAR_DATA *)0x0) && (ch->leader == ch || ch->leader == (CHAR_DATA *)0x0)) {
      if ((pCVar9 == ch) || (pCVar9->master == ch)) {
        bVar6 = is_affected_by(pCVar9,0x12);
        if (bVar6) {
          pcVar12 = "You can\'t remove charmed followers from your group.\n\r";
          goto LAB_002a0ffd;
        }
        bVar6 = is_affected_by(ch,0x12);
        if (!bVar6) {
          bVar6 = is_same_group(pCVar9,ch);
          if ((pCVar9 != ch) && (bVar6)) {
            pCVar9->leader = (CHAR_DATA *)0x0;
            act_new("$n removes $N from $s group.",ch,(void *)0x0,pCVar9,1,5);
            act_new("$n removes you from $s group.",ch,(void *)0x0,pCVar9,2,4);
            act_new("You remove $N from your group.",ch,(void *)0x0,pCVar9,3,4);
            check_leadership_affect(pCVar9);
            return;
          }
          pCVar9->leader = ch;
          act_new("$N joins $n\'s group.",ch,(void *)0x0,pCVar9,1,5);
          act_new("You join $n\'s group.",ch,(void *)0x0,pCVar9,2,4);
          act_new("$N joins your group.",ch,(void *)0x0,pCVar9,3,4);
          bVar6 = is_npc(ch);
          if ((!bVar6) && (bVar6 = is_npc(pCVar9), !bVar6)) {
            pCVar10 = char_data::Class(ch);
            bVar6 = RString::operator==(&pCVar10->name,"anti-paladin");
            if ((bVar6) && (1 < ch->pcdata->learned[gsn_traitors_luck])) {
              init_affect(&af);
              af.where = 0;
              af.aftype = 5;
              af.type = gsn_traitors_luck;
              af.level = ch->level;
              af.duration = -1;
              af.bitvector[0]._3_1_ = af.bitvector[0]._3_1_ | 1;
              af.location = 0;
              af.modifier = 0;
              af.pulse_fun = traitor_pulse;
              af.owner = ch;
              new_affect_to_char(ch,&af);
            }
          }
          bVar6 = is_npc(ch);
          if (bVar6) {
            return;
          }
          bVar6 = is_npc(pCVar9);
          if (bVar6) {
            return;
          }
          pCVar10 = char_data::Class(pCVar9);
          bVar6 = RString::operator==(&pCVar10->name,"anti-paladin");
          if (!bVar6) {
            return;
          }
          if (pCVar9->pcdata->learned[gsn_traitors_luck] < 2) {
            return;
          }
          init_affect(&af);
          af.where = 0;
          af.aftype = 5;
          af.type = gsn_traitors_luck;
          af.level = ch->level;
          af.duration = -1;
          af.bitvector[0]._3_1_ = af.bitvector[0]._3_1_ | 1;
          af.location = 0;
          af.modifier = 0;
          af.pulse_fun = traitor_pulse;
          ppCVar13 = &char_list;
          af.owner = pCVar9;
          while (ppCVar13 = &((CHAR_DATA *)ppCVar13)->next->next,
                (CHAR_DATA *)ppCVar13 != (CHAR_DATA *)0x0) {
            if (((CHAR_DATA *)ppCVar13 != ch) &&
               (bVar6 = is_same_group((CHAR_DATA *)ppCVar13,ch), bVar6)) {
              new_affect_to_char((CHAR_DATA *)ppCVar13,&af);
            }
          }
          return;
        }
        pcVar12 = "You like your master too much to leave $m!";
        iVar7 = 2;
      }
      else {
        pcVar12 = "$N isn\'t following you.";
        iVar7 = 3;
      }
      act_new(pcVar12,ch,(void *)0x0,pCVar9,iVar7,4);
      return;
    }
    pcVar12 = "But you are following someone else!\n\r";
  }
LAB_002a0ffd:
  send_to_char(pcVar12,ch);
  return;
}

Assistant:

void do_group(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		std::string buffer;
		char buf2[MAX_STRING_LENGTH];
		auto leader = ch->leader != nullptr ? ch->leader : ch;

		buffer = fmt::format("{}'s group:\n\r", pers(leader, ch));
		send_to_char(buffer.c_str(), ch);

		for (auto gch = char_list; gch != nullptr; gch = gch->next)
		{
			if (is_same_group(gch, ch))
			{
				if (!is_npc(gch))
				{
					auto exp_tnl = (gch->level * exp_per_level(gch) - gch->exp);
					auto epl = pc_race_table[gch->race].xpadd + 1500;
					epl += (int)((gch->level - 2) * epl * 0.08);
					auto exp_ltl = (gch->level * exp_per_level(gch) - (gch->level - 1) * epl);
					buffer = fmt::sprintf("[%2d %s] %-32s %3d%%hp %3d%%mana %3d%%mv %3d%%tnl\n\r",
							gch->level,
							is_npc(gch) ? "Mob" : gch->Class()->who_name,
							capitalize(pers(gch, ch)),
							(gch->max_hit == 0) ? 0 : (gch->hit * 100) / gch->max_hit,
							(gch->max_mana == 0) ? 0 : (gch->mana * 100) / gch->max_mana,
							(gch->max_move == 0) ? 0 : (gch->move * 100) / gch->max_move,
							URANGE(0, (exp_tnl * 100) / exp_ltl, 100));
				}
				else
				{
					sprintf(buf2, "%s", pers(gch, ch));
					if (buf2[0] != '\0')
						buf2[0] = UPPER(buf2[0]);

					buffer = fmt::sprintf("[Minion] %-32s %3d%%hp %3d%%mana %3d%%mv\n\r",
							buf2,
							(gch->max_hit == 0) ? 0 : (gch->hit * 100) / gch->max_hit,
							(gch->max_mana == 0) ? 0 : (gch->mana * 100) / gch->max_mana,
							(gch->max_move == 0) ? 0 : (gch->move * 100) / gch->max_move);
				}

				send_to_char(buffer.c_str(), ch);
			}
		}

		return;
	}

	auto victim = get_char_room(ch, arg);
	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (ch->master != nullptr || (ch->leader != nullptr && ch->leader != ch))
	{
		send_to_char("But you are following someone else!\n\r", ch);
		return;
	}

	if (victim->master != ch && ch != victim)
	{
		act_new("$N isn't following you.", ch, nullptr, victim, TO_CHAR, POS_SLEEPING);
		return;
	}

	if (is_affected_by(victim, AFF_CHARM))
	{
		send_to_char("You can't remove charmed followers from your group.\n\r", ch);
		return;
	}

	if (is_affected_by(ch, AFF_CHARM))
	{
		act_new("You like your master too much to leave $m!", ch, nullptr, victim, TO_VICT, POS_SLEEPING);
		return;
	}

	if (is_same_group(victim, ch) && ch != victim)
	{
		victim->leader = nullptr;
		act_new("$n removes $N from $s group.", ch, nullptr, victim, TO_NOTVICT, POS_RESTING);
		act_new("$n removes you from $s group.", ch, nullptr, victim, TO_VICT, POS_SLEEPING);
		act_new("You remove $N from your group.", ch, nullptr, victim, TO_CHAR, POS_SLEEPING);
		check_leadership_affect(victim);
		return;
	}

	victim->leader = ch;
	act_new("$N joins $n's group.", ch, nullptr, victim, TO_NOTVICT, POS_RESTING);
	act_new("You join $n's group.", ch, nullptr, victim, TO_VICT, POS_SLEEPING);
	act_new("$N joins your group.", ch, nullptr, victim, TO_CHAR, POS_SLEEPING);

	AFFECT_DATA af;
	if (!is_npc(ch) && !is_npc(victim) && ch->Class()->name == "anti-paladin" && ch->pcdata->learned[gsn_traitors_luck] > 1)
	{
		init_affect(&af);
		af.where = TO_AFFECTS;
		af.aftype = AFT_INVIS;
		af.type = gsn_traitors_luck;
		af.owner = ch;
		af.level = ch->level;
		af.duration = -1;
		SET_BIT(af.bitvector, AFF_PERMANENT);
		af.modifier = 0;
		af.location = 0;
		af.pulse_fun = traitor_pulse;
		new_affect_to_char(ch, &af);
	}

	if (!is_npc(ch) && !is_npc(victim) && victim->Class()->name == "anti-paladin" && victim->pcdata->learned[gsn_traitors_luck] > 1)
	{
		init_affect(&af);
		af.where = TO_AFFECTS;
		af.aftype = AFT_INVIS;
		af.type = gsn_traitors_luck;
		af.owner = victim;
		af.level = ch->level;
		af.duration = -1;
		SET_BIT(af.bitvector, AFF_PERMANENT);
		af.modifier = 0;
		af.location = 0;
		af.pulse_fun = traitor_pulse;

		for (auto vch = char_list; vch; vch = vch->next)
		{
			if (vch != ch && is_same_group(vch, ch))
				new_affect_to_char(vch, &af);
		}
	}
}